

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void cpool_close_and_destroy(cpool *cpool,connectdata *conn,Curl_easy *data,_Bool do_shutdown)

{
  _Bool local_22;
  byte local_21;
  _Bool done;
  Curl_easy *pCStack_20;
  _Bool do_shutdown_local;
  Curl_easy *data_local;
  connectdata *conn_local;
  cpool *cpool_local;
  
  pCStack_20 = data;
  if (data == (Curl_easy *)0x0) {
    pCStack_20 = cpool->idata;
  }
  local_21 = do_shutdown;
  data_local = (Curl_easy *)conn;
  conn_local = (connectdata *)cpool;
  Curl_attach_connection(pCStack_20,conn);
  cpool_run_conn_shutdown_handler(pCStack_20,(connectdata *)data_local);
  if ((local_21 & 1) != 0) {
    cpool_run_conn_shutdown(pCStack_20,(connectdata *)data_local,&local_22);
  }
  Curl_conn_close(pCStack_20,1);
  Curl_conn_close(pCStack_20,0);
  Curl_detach_connection(pCStack_20);
  Curl_conn_free(pCStack_20,(connectdata *)data_local);
  return;
}

Assistant:

static void cpool_close_and_destroy(struct cpool *cpool,
                                    struct connectdata *conn,
                                    struct Curl_easy *data,
                                    bool do_shutdown)
{
  bool done;

  /* there must be a connection to close */
  DEBUGASSERT(conn);
  /* it must be removed from the connection pool */
  DEBUGASSERT(!conn->bits.in_cpool);
  /* there must be an associated transfer */
  DEBUGASSERT(data || cpool);
  if(!data)
    data = cpool->idata;

  /* the transfer must be detached from the connection */
  DEBUGASSERT(data && !data->conn);

  Curl_attach_connection(data, conn);

  cpool_run_conn_shutdown_handler(data, conn);
  if(do_shutdown) {
    /* Make a last attempt to shutdown handlers and filters, if
     * not done so already. */
    cpool_run_conn_shutdown(data, conn, &done);
  }

  if(cpool)
    DEBUGF(infof(data, "[CCACHE] closing #%" FMT_OFF_T,
                 conn->connection_id));
  else
    DEBUGF(infof(data, "closing connection #%" FMT_OFF_T,
                 conn->connection_id));
  Curl_conn_close(data, SECONDARYSOCKET);
  Curl_conn_close(data, FIRSTSOCKET);
  Curl_detach_connection(data);

  Curl_conn_free(data, conn);
}